

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayout::removePlaceHolder(QDockAreaLayout *this,QString *name)

{
  QDockWidgetGroupWindow *this_00;
  QDockWidgetGroupWindow **ppQVar1;
  QDockAreaLayoutInfo *pQVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_90;
  QArrayDataPointer<QDockWidgetGroupWindow_*> local_78;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOfPlaceHolder((QList<int> *)&local_58,this,name);
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    remove(this,(char *)&local_58);
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QDockWidgetGroupWindow*>
            ((QList<QDockWidgetGroupWindow_*> *)&local_78,(QObject *)this->mainWindow,
             (FindChildOptions)0x0);
  ppQVar1 = local_78.ptr;
  lVar3 = local_78.size << 3;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 8) {
    this_00 = *(QDockWidgetGroupWindow **)((long)ppQVar1 + lVar4);
    pQVar2 = QDockWidgetGroupWindow::layoutInfo(this_00);
    QDockAreaLayoutInfo::indexOfPlaceHolder((QList<int> *)&local_90,pQVar2,name);
    QArrayDataPointer<int>::operator=(&local_58,&local_90);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_90);
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      pQVar2 = QDockWidgetGroupWindow::layoutInfo(this_00);
      QDockAreaLayoutInfo::remove(pQVar2,(char *)&local_58);
      QDockWidgetGroupWindow::destroyOrHideIfEmpty(this_00);
    }
  }
  QArrayDataPointer<QDockWidgetGroupWindow_*>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::removePlaceHolder(const QString &name)
{
    QList<int> index = indexOfPlaceHolder(name);
    if (!index.isEmpty())
        remove(index);
    const auto groups =
            mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        index = dwgw->layoutInfo()->indexOfPlaceHolder(name);
        if (!index.isEmpty()) {
            dwgw->layoutInfo()->remove(index);
            dwgw->destroyOrHideIfEmpty();
        }
    }
}